

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case2022(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_6fe;
  allocator<char> local_6fd;
  allocator<char> local_6fc;
  allocator<char> local_6fb;
  allocator<char> local_6fa;
  allocator<char> local_6f9;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658 [32];
  Expectation local_638;
  Expectation local_580;
  Decl local_4c8;
  Decl local_400;
  Decl local_338;
  Decl local_270;
  Decl local_1a8;
  Decl local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,
             "\nstruct\n{\n    struct\n    {\n         struct s\n         {\n             int x ;\n         } y ;\n    } z ;\n} _ ;\n         "
             ,&local_6f9);
  Expectation::Expectation(&local_638);
  Decl::Decl(&local_1a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"y",&local_6fa);
  pDVar1 = Decl::Member(&local_1a8,&local_678,FieldDeclaration);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"s",&local_6fb);
  pDVar1 = Ty::Tag(&pDVar1->ty_,&local_698,Struct,None);
  Decl::Decl(&local_e0,pDVar1);
  pEVar2 = Expectation::declaration(&local_638,&local_e0);
  Decl::Decl(&local_338);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"x",&local_6fc);
  pDVar1 = Decl::Member(&local_338,&local_6b8,FieldDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_270,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_270);
  Decl::Decl(&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"z",&local_6fd);
  pDVar1 = Decl::Member(&local_4c8,&local_6d8,FieldDeclaration);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"",&local_6fe);
  __len = 6;
  pDVar1 = Ty::Tag(&pDVar1->ty_,&local_6f8,Struct,None);
  Decl::Decl(&local_400,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_400);
  Expectation::Expectation(&local_580,pEVar2);
  bind(this,(int)local_658,(sockaddr *)&local_580,__len);
  Expectation::~Expectation(&local_580);
  Decl::~Decl(&local_400);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  Decl::~Decl(&local_4c8);
  Decl::~Decl(&local_270);
  std::__cxx11::string::~string((string *)&local_6b8);
  Decl::~Decl(&local_338);
  Decl::~Decl(&local_e0);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  Decl::~Decl(&local_1a8);
  Expectation::~Expectation(&local_638);
  std::__cxx11::string::~string(local_658);
  return;
}

Assistant:

void DeclarationBinderTester::case2022()
{
    bind(R"(
struct
{
    struct
    {
         struct s
         {
             int x ;
         } y ;
    } z ;
} _ ;
         )",
         Expectation()
            .declaration(
                Decl().Member("y", SymbolKind::FieldDeclaration).ty_.Tag("s", TagTypeKind::Struct))
            .declaration(
                Decl().Member("x", SymbolKind::FieldDeclaration).ty_.Basic(BasicTypeKind::Int_S))
            .declaration(
                Decl().Member("z", SymbolKind::FieldDeclaration).ty_.Tag("", TagTypeKind::Struct))
         );
}